

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_is_sct_list_valid(CBS *contents)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_48 [8];
  CBS sct;
  CBS sct_list;
  CBS copy;
  CBS *contents_local;
  
  sct_list.len = (size_t)contents->data;
  iVar1 = CBS_get_u16_length_prefixed((CBS *)&sct_list.len,(CBS *)&sct.len);
  if ((iVar1 != 0) && (sVar2 = CBS_len((CBS *)&sct_list.len), sVar2 == 0)) {
    sVar2 = CBS_len((CBS *)&sct.len);
    while (sVar2 != 0) {
      sVar2 = CBS_len((CBS *)&sct.len);
      if (sVar2 == 0) {
        return true;
      }
      iVar1 = CBS_get_u16_length_prefixed((CBS *)&sct.len,(CBS *)local_48);
      if (iVar1 == 0) {
        return false;
      }
      sVar2 = CBS_len((CBS *)local_48);
    }
  }
  return false;
}

Assistant:

bool ssl_is_sct_list_valid(const CBS *contents) {
  // Shallow parse the SCT list for sanity. By the RFC
  // (https://tools.ietf.org/html/rfc6962#section-3.3) neither the list nor any
  // of the SCTs may be empty.
  CBS copy = *contents;
  CBS sct_list;
  if (!CBS_get_u16_length_prefixed(&copy, &sct_list) || CBS_len(&copy) != 0 ||
      CBS_len(&sct_list) == 0) {
    return false;
  }

  while (CBS_len(&sct_list) > 0) {
    CBS sct;
    if (!CBS_get_u16_length_prefixed(&sct_list, &sct) || CBS_len(&sct) == 0) {
      return false;
    }
  }

  return true;
}